

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.c
# Opt level: O0

int parse_range_dec64(char **str_num,uint8_t dig,int64_t *num)

{
  bool bVar1;
  ushort **ppuVar2;
  int64_t iVar3;
  bool local_45;
  uint8_t local_43;
  char local_42;
  char local_41;
  int8_t trailing_zeros;
  int8_t str_dig;
  long lStack_40;
  int8_t str_exp;
  int64_t ret;
  char *pcStack_30;
  int minus;
  char *ptr;
  int64_t *num_local;
  uint8_t dig_local;
  char **str_num_local;
  
  bVar1 = false;
  lStack_40 = 0;
  local_42 = -1;
  local_43 = '\0';
  pcStack_30 = *str_num;
  if (*pcStack_30 == '-') {
    bVar1 = true;
    pcStack_30 = pcStack_30 + 1;
  }
  else if (*pcStack_30 == '+') {
    pcStack_30 = pcStack_30 + 1;
  }
  ppuVar2 = __ctype_b_loc();
  if (((*ppuVar2)[(int)*pcStack_30] & 0x800) == 0) {
    str_num_local._4_4_ = 1;
  }
  else {
    local_41 = '\0';
    while( true ) {
      ppuVar2 = __ctype_b_loc();
      local_45 = true;
      if (((*ppuVar2)[(int)*pcStack_30] & 0x800) == 0) {
        local_45 = *pcStack_30 == '.' && local_42 < '\0';
      }
      if (!local_45) break;
      if ('\x12' < local_41) {
        return 1;
      }
      if (*pcStack_30 == '.') {
        if (pcStack_30[1] == '.') break;
        local_42 = local_42 + '\x01';
      }
      else {
        lStack_40 = lStack_40 * 10 + (long)(*pcStack_30 + -0x30);
        if (-1 < local_42) {
          local_42 = local_42 + '\x01';
          if (*pcStack_30 == '0') {
            local_43 = local_43 + '\x01';
          }
          else {
            local_43 = '\0';
          }
        }
        local_41 = local_41 + '\x01';
      }
      pcStack_30 = pcStack_30 + 1;
    }
    if (local_42 == '\0') {
      str_num_local._4_4_ = 1;
    }
    else {
      if (local_42 == -1) {
        local_42 = '\0';
      }
      if (local_43 != '\0') {
        local_42 = local_42 - local_43;
        local_41 = local_41 - local_43;
        iVar3 = dec_pow(local_43);
        lStack_40 = lStack_40 / iVar3;
      }
      if ((int)local_42 < (int)(uint)dig) {
        if (0x12 < (int)(local_41 + -1 + ((uint)dig - (int)local_42))) {
          return 1;
        }
        iVar3 = dec_pow(dig - local_42);
        lStack_40 = iVar3 * lStack_40;
      }
      if ((int)(uint)dig < (int)local_42) {
        str_num_local._4_4_ = 1;
      }
      else {
        if (bVar1) {
          lStack_40 = -lStack_40;
        }
        *str_num = pcStack_30;
        *num = lStack_40;
        str_num_local._4_4_ = 0;
      }
    }
  }
  return str_num_local._4_4_;
}

Assistant:

int
parse_range_dec64(const char **str_num, uint8_t dig, int64_t *num)
{
    const char *ptr;
    int minus = 0;
    int64_t ret = 0;
    int8_t str_exp, str_dig = -1, trailing_zeros = 0;

    ptr = *str_num;

    if (ptr[0] == '-') {
        minus = 1;
        ++ptr;
    } else if (ptr[0] == '+') {
        ++ptr;
    }

    if (!isdigit(ptr[0])) {
        /* there must be at least one */
        return 1;
    }

    for (str_exp = 0; isdigit(ptr[0]) || ((ptr[0] == '.') && (str_dig < 0)); ++ptr) {
        if (str_exp > 18) {
            return 1;
        }

        if (ptr[0] == '.') {
            if (ptr[1] == '.') {
                /* it's the next interval */
                break;
            }
            ++str_dig;
        } else {
            ret = ret * 10 + (ptr[0] - '0');
            if (str_dig > -1) {
                ++str_dig;
                if (ptr[0] == '0') {
                    /* possibly trailing zero */
                    trailing_zeros++;
                } else {
                    trailing_zeros = 0;
                }
            }
            ++str_exp;
        }
    }
    if (str_dig == 0) {
        /* no digits after '.' */
        return 1;
    } else if (str_dig == -1) {
        /* there are 0 numbers after the floating point */
        str_dig = 0;
    }
    /* remove trailing zeros */
    if (trailing_zeros) {
        str_dig -= trailing_zeros;
        str_exp -= trailing_zeros;
        ret = ret / dec_pow(trailing_zeros);
    }

    /* it's parsed, now adjust the number based on fraction-digits, if needed */
    if (str_dig < dig) {
        if ((str_exp - 1) + (dig - str_dig) > 18) {
            return 1;
        }
        ret *= dec_pow(dig - str_dig);
    }
    if (str_dig > dig) {
        return 1;
    }

    if (minus) {
        ret *= -1;
    }
    *str_num = ptr;
    *num = ret;

    return 0;
}